

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  string *psVar1;
  TestProperty *pTVar2;
  Message *pMVar3;
  int i;
  string local_98;
  string local_78;
  pointer local_58;
  string *local_50;
  string *local_48;
  allocator<char> local_39;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message attributes;
  
  local_50 = indent;
  local_48 = __return_storage_ptr__;
  Message::Message((Message *)&local_38);
  for (i = 0; psVar1 = local_48,
      i < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6); i = i + 1) {
    pTVar2 = TestResult::GetTestProperty(result,i);
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),",\n");
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)local_50);
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),"\"");
    local_58 = (pTVar2->key_)._M_dataplus._M_p;
    pMVar3 = Message::operator<<((Message *)&local_38,&local_58);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [4])"\": ");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x17879a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,(pTVar2->value_)._M_dataplus._M_p,&local_39);
    EscapeJson(&local_98,&local_78);
    pMVar3 = Message::operator<<(pMVar3,&local_98);
    Message::operator<<(pMVar3,(char (*) [2])0x17879a);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  StringStreamToString(local_48,local_38.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
  return psVar1;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}